

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
TasGrid::GridLocalPolynomial::getSubGraph<(TasGrid::RuleLocal::erule)0>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,GridLocalPolynomial *this,
          vector<int,_std::allocator<int>_> *point)

{
  int *piVar1;
  iterator __position;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  vector<int,_std::allocator<int>_> monkey_count;
  int slot;
  vector<int,_std::allocator<int>_> monkey_tail;
  vector<bool,_std::allocator<bool>_> used;
  vector<int,_std::allocator<int>_> p;
  vector<int,_std::allocator<int>_> local_b8;
  uint local_9c;
  void *local_98;
  iterator iStack_90;
  int *local_88;
  int local_74;
  vector<bool,_std::allocator<bool>_> local_70;
  vector<int,_std::allocator<int>_> local_48;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_48,(vector<int,_std::allocator<int>_> *)point);
  local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start & 0xffffffffffffff00);
  ::std::vector<bool,_std::allocator<bool>_>::vector
            (&local_70,(long)(this->super_BaseCanonicalGrid).points.cache_num_indexes,
             (bool *)&local_b8,(allocator_type *)&local_98);
  iVar6 = (this->super_BaseCanonicalGrid).num_dimensions;
  local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)operator_new(4);
  iVar6 = iVar6 * 4;
  local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start + 1;
  *local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       0;
  local_98 = (void *)0x0;
  iStack_90._M_current = (int *)0x0;
  local_88 = (int *)0x0;
  local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if (*local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start < iVar6) {
    do {
      iVar3 = local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish[-1];
      if (iVar3 < iVar6) {
        iVar2 = iVar3 + 3;
        if (-1 < iVar3) {
          iVar2 = iVar3;
        }
        iVar2 = iVar2 >> 2;
        if (iStack_90._M_current == local_88) {
          ::std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_98,iStack_90,
                     local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + iVar2);
        }
        else {
          *iStack_90._M_current =
               local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[iVar2];
          iStack_90._M_current = iStack_90._M_current + 1;
        }
        iVar3 = RuleLocal::getKid<(TasGrid::RuleLocal::erule)0>
                          (iStack_90._M_current[-1],
                           local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish[-1] % 4);
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar2] = iVar3;
        local_9c = MultiIndexSet::getSlot
                             (&(this->super_BaseCanonicalGrid).points,
                              local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
        if (local_9c != 0xffffffff) {
          uVar5 = (ulong)(int)local_9c;
          uVar4 = uVar5 + 0x3f;
          if (-1 < (long)uVar5) {
            uVar4 = uVar5;
          }
          if ((local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p
               [((long)uVar4 >> 6) +
                ((ulong)((uVar5 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
               ((ulong)local_9c & 0x3f) & 1) == 0) {
            __position._M_current =
                 (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              ::std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)__return_storage_ptr__,__position,
                         (int *)&local_9c);
            }
            else {
              *__position._M_current = local_9c;
              (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            uVar5 = (ulong)(int)local_9c;
            uVar4 = uVar5 + 0x3f;
            if (-1 < (long)uVar5) {
              uVar4 = uVar5;
            }
            local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p
            [((long)uVar4 >> 6) + ((ulong)((uVar5 & 0x800000000000003f) < 0x8000000000000001) - 1)]
                 = local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [((long)uVar4 >> 6) +
                    ((ulong)((uVar5 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
                   1L << ((byte)local_9c & 0x3f);
            local_74 = 0;
            if (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              ::std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (&local_b8,
                         (iterator)
                         local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_74);
            }
            else {
              *local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = 0;
              local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish = local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
            }
            goto LAB_0018c893;
          }
        }
        piVar1 = iStack_90._M_current + -1;
        iStack_90._M_current = iStack_90._M_current + -1;
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar2] = *piVar1;
        local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish[-1] =
             local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish[-1] + 1;
      }
      else {
        iVar3 = local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish[-2];
        iVar2 = iVar3 + 3;
        if (-1 < iVar3) {
          iVar2 = iVar3;
        }
        piVar1 = iStack_90._M_current + -1;
        iStack_90._M_current = iStack_90._M_current + -1;
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar2 >> 2] = *piVar1;
        local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish[-2] =
             local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish[-2] + 1;
        local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + -1;
      }
LAB_0018c893:
    } while (*local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start < iVar6);
  }
  if (local_98 != (void *)0x0) {
    operator_delete(local_98,(long)local_88 - (long)local_98);
  }
  if (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> GridLocalPolynomial::getSubGraph(std::vector<int> const &point) const{
    std::vector<int> graph, p = point;
    std::vector<bool> used(points.getNumIndexes(), false);
    int max_1d_kids = RuleLocal::getMaxNumKids<effrule>();
    int max_kids = max_1d_kids * num_dimensions;

    std::vector<int> monkey_count(1, 0), monkey_tail;

    while(monkey_count[0] < max_kids){
        if (monkey_count.back() < max_kids){
            int dim = monkey_count.back() / max_1d_kids;
            monkey_tail.push_back(p[dim]);
            p[dim] = RuleLocal::getKid<effrule>(monkey_tail.back(), monkey_count.back() % max_1d_kids);
            int slot = points.getSlot(p);
            if ((slot == -1) || used[slot]){ // this kid is missing
                p[dim] = monkey_tail.back();
                monkey_tail.pop_back();
                monkey_count.back()++;
            }else{ // found kid, go deeper in the graph
                graph.push_back(slot);
                used[slot] = true;
                monkey_count.push_back(0);
            }
        }else{
            monkey_count.pop_back();
            int dim = monkey_count.back() / max_1d_kids;
            p[dim] = monkey_tail.back();
            monkey_tail.pop_back();
            monkey_count.back()++;
        }
    }

    return graph;
}